

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::UtilsTest_HexEncodingDecoding_ByteArraysEqualAfterEncodingDecoding_Test::TestBody
          (UtilsTest_HexEncodingDecoding_ByteArraysEqualAfterEncodingDecoding_Test *this)

{
  pointer puVar1;
  _Alloc_hider _Var2;
  ByteArray *aBytes;
  char *pcVar3;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ByteArray buf;
  string hexStr;
  allocator_type local_91;
  AssertHelper local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  Error local_70;
  ByteArray local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_90.data_._0_4_ = 0x3020100;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_90;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_88,__l,&local_91);
  utils::Hex_abi_cxx11_((string *)&local_70,(utils *)&local_88,aBytes);
  std::__cxx11::string::operator=((string *)&local_30,(string *)&local_70);
  if ((size_type *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode) !=
      &local_70.mMessage._M_string_length) {
    operator_delete((undefined1 *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode));
  }
  if ((void *)CONCAT71(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&local_70,"hexStr","\"00010203\"",&local_30,(char (*) [9])"00010203");
  if ((undefined1)local_70.mCode == kNone) {
    testing::Message::Message((Message *)&local_88);
    if (local_70.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar3 = *(char **)local_70.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT71(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_88.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  _Var2._M_p = local_70.mMessage._M_dataplus._M_p;
  if (local_70.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_70.mMessage._M_dataplus._M_p != local_70.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_70.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var2._M_p);
  }
  utils::Hex(&local_70,&local_48,&local_30);
  local_90.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_88,"utils::Hex(buf, hexStr)","ErrorCode::kNone",&local_70,
             (ErrorCode *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.mMessage._M_dataplus._M_p != &local_70.mMessage.field_2) {
    operator_delete(local_70.mMessage._M_dataplus._M_p);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (utils)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar3 = *(char **)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
               ,0x5e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode) + 8))();
    }
  }
  puVar1 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(puVar1);
  }
  local_90.data_._0_4_ = 0x3020100;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,__l_00,&local_91);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((internal *)&local_88,"buf","(ByteArray{0x00, 0x01, 0x02, 0x03})",&local_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  if ((void *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode));
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (utils)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar3 = *(char **)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/common/utils_test.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_70._1_7_,(undefined1)local_70.mCode) + 8))();
    }
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (*(pointer *)
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish !=
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish + 0x10) {
      operator_delete(*(pointer *)
                       local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(UtilsTest, HexEncodingDecoding_EmptyStringDecodedIntoEmptyByteArray)
{
    ByteArray   buf;
    std::string hexStr;

    EXPECT_EQ(utils::Hex(buf, hexStr), ErrorCode::kNone);
    EXPECT_TRUE(buf.empty());
}